

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_std_suite.cpp
# Opt level: O0

void compact_vector_suite::test_int64(void)

{
  reference pvVar1;
  undefined8 local_158 [2];
  undefined8 local_148 [2];
  undefined8 local_138 [2];
  undefined8 local_128 [3];
  char *msg;
  allocator<long> local_f9;
  long local_f8;
  undefined1 local_f0 [8];
  vector<long,_std::allocator<long>_> value;
  iarchive in;
  value_type input [34];
  
  in.reader.stack.c.
  super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x51413121110120ae;
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[34]>
            ((iarchive *)
             &value.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,
             (uchar (*) [34])
             ((long)&in.reader.stack.c.
                     super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                     ._M_impl.super__Deque_impl_data + 0x48));
  local_f8 = std::numeric_limits<long>::max();
  std::allocator<long>::allocator(&local_f9);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)local_f0,4,&local_f8,&local_f9);
  std::allocator<long>::~allocator(&local_f9);
  boost::archive::detail::interface_iarchive<trial::protocol::bintoken::iarchive>::operator>>
            ((interface_iarchive<trial::protocol::bintoken::iarchive> *)
             &value.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(vector<long,_std::allocator<long>_> *)local_f0);
  pvVar1 = std::vector<long,_std::allocator<long>_>::operator[]
                     ((vector<long,_std::allocator<long>_> *)local_f0,0);
  local_128[0] = 0x7161514131211101;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,long>
            ("value[0]","INT64_C(0x7161514131211101)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x284,"void compact_vector_suite::test_int64()",pvVar1,local_128);
  pvVar1 = std::vector<long,_std::allocator<long>_>::operator[]
                     ((vector<long,_std::allocator<long>_> *)local_f0,1);
  local_138[0] = 0x7262524232221202;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,long>
            ("value[1]","INT64_C(0x7262524232221202)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x285,"void compact_vector_suite::test_int64()",pvVar1,local_138);
  pvVar1 = std::vector<long,_std::allocator<long>_>::operator[]
                     ((vector<long,_std::allocator<long>_> *)local_f0,2);
  local_148[0] = 0x7363534333231303;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,long>
            ("value[2]","INT64_C(0x7363534333231303)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x286,"void compact_vector_suite::test_int64()",pvVar1,local_148);
  pvVar1 = std::vector<long,_std::allocator<long>_>::operator[]
                     ((vector<long,_std::allocator<long>_> *)local_f0,3);
  local_158[0] = 0x7464544434241404;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,long>
            ("value[3]","INT64_C(0x7464544434241404)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x287,"void compact_vector_suite::test_int64()",pvVar1,local_158);
  std::vector<long,_std::allocator<long>_>::~vector((vector<long,_std::allocator<long>_> *)local_f0)
  ;
  trial::protocol::bintoken::iarchive::~iarchive
            ((iarchive *)
             &value.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  return;
}

Assistant:

void test_int64()
{
    const value_type input[] = { token::code::array8_int64, 4 * token::int64::size,
                                 0x01, 0x11, 0x21, 0x31, 0x41, 0x51, 0x61, 0x71,
                                 0x02, 0x12, 0x22, 0x32, 0x42, 0x52, 0x62, 0x72,
                                 0x03, 0x13, 0x23, 0x33, 0x43, 0x53, 0x63, 0x73,
                                 0x04, 0x14, 0x24, 0x34, 0x44, 0x54, 0x64, 0x74 };
    format::iarchive in(input);
    std::vector<std::int64_t> value(4, std::numeric_limits<std::int64_t>::max());
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST_EQUAL(value[0], INT64_C(0x7161514131211101));
    TRIAL_PROTOCOL_TEST_EQUAL(value[1], INT64_C(0x7262524232221202));
    TRIAL_PROTOCOL_TEST_EQUAL(value[2], INT64_C(0x7363534333231303));
    TRIAL_PROTOCOL_TEST_EQUAL(value[3], INT64_C(0x7464544434241404));
}